

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O2

void runOnce<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ostream *poVar5;
  Sequence *pSVar6;
  atomic<long> *paVar7;
  ulong *puVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  int i_1;
  ulong uVar12;
  thread *ptVar13;
  Sequence *pSVar14;
  int i;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  string local_148;
  string local_128;
  reference_wrapper<disruptor::Sequence> local_108;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> s;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Staring run ");
  std::endl<char,std::char_traits<char>>(poVar5);
  LOCK();
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)0;
  UNLOCK();
  uVar12 = (ulong)nc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  uVar10 = 0xffffffffffffffff;
  uVar11 = SUB168(auVar2 * ZEXT816(0x78),0);
  if (SUB168(auVar2 * ZEXT816(0x78),8) != 0) {
    uVar11 = uVar10;
  }
  pSVar6 = (Sequence *)operator_new__(uVar11);
  auVar3 = _DAT_0012b020;
  auVar2 = _DAT_0012b010;
  if (uVar12 != 0) {
    uVar11 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar12 * 0x78 - 0x78;
    auVar1 = auVar1 / ZEXT816(0x78);
    auVar17._8_4_ = auVar1._0_4_;
    auVar17._0_8_ = auVar1._0_8_;
    auVar17._12_4_ = auVar1._4_4_;
    paVar7 = &pSVar6[1].sequence_;
    auVar17 = auVar17 ^ _DAT_0012b020;
    do {
      auVar18._8_4_ = (int)uVar11;
      auVar18._0_8_ = uVar11;
      auVar18._12_4_ = (int)(uVar11 >> 0x20);
      auVar18 = (auVar18 | auVar2) ^ auVar3;
      if ((bool)(~(auVar18._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar18._0_4_ ||
                  auVar17._4_4_ < auVar18._4_4_) & 1)) {
        paVar7[-0xf] = (__atomic_base<long>)0xffffffffffffffff;
      }
      if ((auVar18._12_4_ != auVar17._12_4_ || auVar18._8_4_ <= auVar17._8_4_) &&
          auVar18._12_4_ <= auVar17._12_4_) {
        (paVar7->super___atomic_base<long>)._M_i = -1;
      }
      uVar11 = uVar11 + 2;
      paVar7 = paVar7 + 0x1e;
    } while ((auVar1._0_8_ + 2U & 0x7fffffffffffffe) != uVar11);
  }
  seqs.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  seqs.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  seqs.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
  Sequencer(&s,RING_BUFFER_SIZE);
  pSVar14 = pSVar6;
  for (lVar15 = 0; lVar15 < nc; lVar15 = lVar15 + 1) {
    local_128._M_dataplus._M_p = (pointer)pSVar14;
    std::vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>>::
    emplace_back<disruptor::Sequence*>
              ((vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>> *)&seqs,
               (Sequence **)&local_128);
    pSVar14 = pSVar14 + 1;
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::operator=
            (&s.gating_sequences_,&seqs);
  iVar4 = nc;
  uVar16 = (ulong)nc;
  uVar11 = uVar16 * 8;
  uVar12 = uVar11 + 8;
  if (0xfffffffffffffff7 < uVar11) {
    uVar12 = uVar10;
  }
  if ((long)uVar16 < 0) {
    uVar12 = uVar10;
  }
  puVar8 = (ulong *)operator_new__(uVar12);
  *puVar8 = uVar16;
  ptVar13 = (thread *)(puVar8 + 1);
  if (iVar4 != 0) {
    memset(ptVar13,0,uVar11);
  }
  pSVar14 = pSVar6;
  for (lVar15 = 0; iVar4 = np, lVar15 < (int)uVar16; lVar15 = lVar15 + 1) {
    local_148._M_dataplus._M_p = (pointer)&s;
    local_108._M_data = pSVar14;
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>>,std::reference_wrapper<disruptor::Sequence>,void>
              ((thread *)&local_128,
               consume<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy>,
               (reference_wrapper<disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>_>
                *)&local_148,&local_108);
    std::thread::operator=(ptVar13,(thread *)&local_128);
    std::thread::~thread((thread *)&local_128);
    uVar16 = (ulong)(uint)nc;
    ptVar13 = ptVar13 + 1;
    pSVar14 = pSVar14 + 1;
  }
  lVar15 = (long)np;
  uVar10 = lVar15 * 8;
  uVar11 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar11 = 0xffffffffffffffff;
  }
  if (lVar15 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  plVar9 = (long *)operator_new__(uVar11);
  *plVar9 = lVar15;
  ptVar13 = (thread *)(plVar9 + 1);
  if (iVar4 != 0) {
    memset(ptVar13,0,uVar10);
  }
  std::chrono::_V2::system_clock::now();
  for (lVar15 = 0; uVar10 = (ulong)np, lVar15 < (long)uVar10; lVar15 = lVar15 + 1) {
    local_148._M_dataplus._M_p = (pointer)&s;
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>>,void>
              ((thread *)&local_128,
               produce<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy>,
               (reference_wrapper<disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>_>
                *)&local_148);
    std::thread::operator=(ptVar13,(thread *)&local_128);
    std::thread::~thread((thread *)&local_128);
    ptVar13 = ptVar13 + 1;
  }
  for (lVar15 = 0; lVar15 < (int)uVar10; lVar15 = lVar15 + 1) {
    std::thread::join();
    uVar10 = (ulong)(uint)np;
  }
  for (lVar15 = 0; lVar15 < nc; lVar15 = lVar15 + 1) {
    std::thread::join();
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"\nBatch size: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," Ring buffer size: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<((ostream *)&std::cout,"Cursor: ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<((ostream *)&std::cout,"Sum: ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  poVar5 = std::operator<<(poVar5," Expected sum: ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::operator<<(poVar5,'\n');
  std::chrono::_V2::system_clock::now();
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,np);
  poVar5 = std::operator<<(poVar5,"P-");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,nc);
  poVar5 = std::operator<<(poVar5,"C ");
  demangle_abi_cxx11_(&local_128,"N9disruptor22SingleThreadedStrategyE");
  poVar5 = std::operator<<(poVar5,(string *)&local_128);
  poVar5 = std::operator<<(poVar5," ");
  demangle_abi_cxx11_(&local_148,"N9disruptor16BusySpinStrategyE");
  poVar5 = std::operator<<(poVar5,(string *)&local_148);
  std::operator<<(poVar5,'\n');
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar5 = std::operator<<(poVar5," ops/secs");
  std::operator<<(poVar5,"\n\n");
  if (*puVar8 != 0) {
    lVar15 = *puVar8 << 3;
    do {
      std::thread::~thread((thread *)((long)puVar8 + lVar15));
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
  }
  operator_delete__(puVar8);
  if (*plVar9 != 0) {
    lVar15 = *plVar9 << 3;
    do {
      std::thread::~thread((thread *)((long)plVar9 + lVar15));
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
  }
  operator_delete__(plVar9);
  operator_delete__(pSVar6);
  disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
  ~Sequencer(&s);
  std::_Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~_Vector_base
            (&seqs.super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
            );
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  //std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}